

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O2

void __thiscall
Js::JavascriptMap::MarkVisitKindSpecificPtrs(JavascriptMap *this,SnapshotExtractor *extractor)

{
  bool bVar1;
  undefined1 local_38 [8];
  Iterator iterator;
  
  MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  ::Iterator::Iterator((Iterator *)local_38,&this->list);
  while( true ) {
    bVar1 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
            ::Iterator::Next((Iterator *)local_38);
    if (!bVar1) break;
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Key
              ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
               &iterator.current);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,iterator.current.ptr);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Value
              ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
               &iterator.current);
    TTD::SnapshotExtractor::MarkVisitVar(extractor,iterator.current.ptr);
  }
  return;
}

Assistant:

void JavascriptMap::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
{
    auto iterator = GetIterator();
    while(iterator.Next())
    {
        extractor->MarkVisitVar(iterator.Current().Key());
        extractor->MarkVisitVar(iterator.Current().Value());
    }
}